

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

Clause * __thiscall Lib::Deque<Kernel::Clause_*>::pop_front(Deque<Kernel::Clause_*> *this)

{
  Clause *pCVar1;
  Clause *res;
  Deque<Kernel::Clause_*> *this_local;
  
  pCVar1 = *this->_front;
  this->_front = this->_front + 1;
  if (this->_front == this->_end) {
    this->_front = this->_data;
  }
  return pCVar1;
}

Assistant:

inline
  C pop_front()
  {
    ASS(isNonEmpty());

    C res=*_front;
    _front->~C();

    _front++;
    if(_front==_end) {
      _front=_data;
    }

    return res;
  }